

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O2

Fra_Man_t * Fra_ManStart(Aig_Man_t *pManAig,Fra_Par_t *pPars)

{
  int iVar1;
  Fra_Man_t *pFVar2;
  uint *puVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Fra_Cla_t *pFVar6;
  Aig_Obj_t **__s;
  void *pvVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  
  pFVar2 = (Fra_Man_t *)calloc(1,0x158);
  pFVar2->pPars = pPars;
  pFVar2->pManAig = pManAig;
  iVar9 = pManAig->vObjs->nSize;
  pFVar2->nSizeAlloc = iVar9;
  lVar11 = (long)pPars->nFramesK + 1;
  iVar10 = (int)lVar11;
  pFVar2->nFramesAll = iVar10;
  uVar8 = (pManAig->nObjs[2] - pManAig->nRegs) * iVar10 + pManAig->nRegs;
  iVar1 = (((int)uVar8 >> 5) + 1) - (uint)((uVar8 & 0x1f) == 0);
  pFVar2->nPatWords = iVar1;
  puVar3 = (uint *)malloc((long)iVar1 << 2);
  pFVar2->pPatWords = puVar3;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pFVar2->vPiVars = pVVar4;
  pFVar6 = Fra_ClassesStart(pManAig);
  pFVar2->pCla = pFVar6;
  __s = (Aig_Obj_t **)malloc(lVar11 * iVar9 * 8);
  pFVar2->pMemFraig = __s;
  memset(__s,0,(long)iVar10 * (long)iVar9 * 8);
  Aig_ManRandom(1);
  for (iVar9 = 0; iVar9 < pManAig->vObjs->nSize; iVar9 = iVar9 + 1) {
    pvVar7 = Vec_PtrEntry(pManAig->vObjs,iVar9);
    if (pvVar7 != (void *)0x0) {
      *(Fra_Man_t **)((long)pvVar7 + 0x28) = pFVar2;
    }
    pManAig = pFVar2->pManAig;
  }
  return pFVar2;
}

Assistant:

Fra_Man_t * Fra_ManStart( Aig_Man_t * pManAig, Fra_Par_t * pPars )
{
    Fra_Man_t * p;
    Aig_Obj_t * pObj;
    int i;
    // allocate the fraiging manager
    p = ABC_ALLOC( Fra_Man_t, 1 );
    memset( p, 0, sizeof(Fra_Man_t) );
    p->pPars      = pPars;
    p->pManAig    = pManAig;
    p->nSizeAlloc = Aig_ManObjNumMax( pManAig );
    p->nFramesAll = pPars->nFramesK + 1;
    // allocate storage for sim pattern
    p->nPatWords  = Abc_BitWordNum( (Aig_ManCiNum(pManAig) - Aig_ManRegNum(pManAig)) * p->nFramesAll + Aig_ManRegNum(pManAig) );
    p->pPatWords  = ABC_ALLOC( unsigned, p->nPatWords ); 
    p->vPiVars    = Vec_PtrAlloc( 100 );
    // equivalence classes
    p->pCla       = Fra_ClassesStart( pManAig );
    // allocate other members
    p->pMemFraig  = ABC_ALLOC( Aig_Obj_t *, p->nSizeAlloc * p->nFramesAll );
    memset( p->pMemFraig, 0, sizeof(Aig_Obj_t *) * p->nSizeAlloc * p->nFramesAll );
    // set random number generator
//    srand( 0xABCABC );
    Aig_ManRandom(1);
    // set the pointer to the manager
    Aig_ManForEachObj( p->pManAig, pObj, i )
        pObj->pData = p;
    return p;
}